

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_etc.cpp
# Opt level: O1

int __thiscall crnlib::etc1_optimizer::init(etc1_optimizer *this,EVP_PKEY_CTX *ctx)

{
  uint min_new_capacity;
  uint uVar1;
  unsigned_short *puVar2;
  color_quad_u8 *pcVar3;
  uint *puVar4;
  uint32 *puVar5;
  uint i_1;
  int iVar6;
  uint *puVar7;
  int iVar8;
  int iVar9;
  results *in_RDX;
  ulong uVar10;
  long lVar11;
  float fVar12;
  vec3F avg_color;
  vec3F fc;
  undefined8 local_28;
  float local_20;
  float local_1c [3];
  
  this->m_pParams = (params *)ctx;
  this->m_pResult = in_RDX;
  min_new_capacity = *(uint *)(ctx + 8);
  uVar1 = (this->m_selectors).m_size;
  if (uVar1 != min_new_capacity) {
    if (uVar1 <= min_new_capacity) {
      if ((this->m_selectors).m_capacity < min_new_capacity) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)&this->m_selectors,min_new_capacity,
                   uVar1 + 1 == min_new_capacity,1,(object_mover)0x0,false);
      }
      uVar1 = (this->m_selectors).m_size;
      memset((this->m_selectors).m_p + uVar1,0,(ulong)(min_new_capacity - uVar1));
    }
    (this->m_selectors).m_size = min_new_capacity;
  }
  uVar1 = (this->m_best_selectors).m_size;
  if (uVar1 != min_new_capacity) {
    if (uVar1 <= min_new_capacity) {
      if ((this->m_best_selectors).m_capacity < min_new_capacity) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)&this->m_best_selectors,min_new_capacity,
                   uVar1 + 1 == min_new_capacity,1,(object_mover)0x0,false);
      }
      uVar1 = (this->m_best_selectors).m_size;
      memset((this->m_best_selectors).m_p + uVar1,0,(ulong)(min_new_capacity - uVar1));
    }
    (this->m_best_selectors).m_size = min_new_capacity;
  }
  uVar1 = (this->m_temp_selectors).m_size;
  if (uVar1 != min_new_capacity) {
    if (uVar1 <= min_new_capacity) {
      if ((this->m_temp_selectors).m_capacity < min_new_capacity) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)&this->m_temp_selectors,min_new_capacity,
                   uVar1 + 1 == min_new_capacity,1,(object_mover)0x0,false);
      }
      uVar1 = (this->m_temp_selectors).m_size;
      memset((this->m_temp_selectors).m_p + uVar1,0,(ulong)(min_new_capacity - uVar1));
    }
    (this->m_temp_selectors).m_size = min_new_capacity;
  }
  uVar1 = (this->m_trial_solution).m_selectors.m_size;
  if (uVar1 != min_new_capacity) {
    if (uVar1 <= min_new_capacity) {
      if ((this->m_trial_solution).m_selectors.m_capacity < min_new_capacity) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)&(this->m_trial_solution).m_selectors,min_new_capacity,
                   uVar1 + 1 == min_new_capacity,1,(object_mover)0x0,false);
      }
      uVar1 = (this->m_trial_solution).m_selectors.m_size;
      memset((this->m_trial_solution).m_selectors.m_p + uVar1,0,(ulong)(min_new_capacity - uVar1));
    }
    (this->m_trial_solution).m_selectors.m_size = min_new_capacity;
  }
  uVar1 = (this->m_best_solution).m_selectors.m_size;
  if (uVar1 != min_new_capacity) {
    if (uVar1 <= min_new_capacity) {
      if ((this->m_best_solution).m_selectors.m_capacity < min_new_capacity) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)&(this->m_best_solution).m_selectors,min_new_capacity,
                   uVar1 + 1 == min_new_capacity,1,(object_mover)0x0,false);
      }
      uVar1 = (this->m_best_solution).m_selectors.m_size;
      memset((this->m_best_solution).m_selectors.m_p + uVar1,0,(ulong)(min_new_capacity - uVar1));
    }
    (this->m_best_solution).m_selectors.m_size = min_new_capacity;
  }
  this->m_limit = (this->m_pParams->m_use_color4 ^ 1) << 4 | 0xf;
  local_20 = 0.0;
  local_28 = 0;
  uVar1 = (this->m_luma).m_size;
  if (uVar1 != min_new_capacity) {
    if (uVar1 <= min_new_capacity) {
      if ((this->m_luma).m_capacity < min_new_capacity) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)&this->m_luma,min_new_capacity,uVar1 + 1 == min_new_capacity,
                   2,(object_mover)0x0,false);
      }
      uVar1 = (this->m_luma).m_size;
      memset((this->m_luma).m_p + uVar1,0,(ulong)(min_new_capacity - uVar1) * 2);
    }
    (this->m_luma).m_size = min_new_capacity;
  }
  uVar1 = this->m_sorted_luma[0].m_size;
  if (uVar1 != min_new_capacity) {
    if (uVar1 <= min_new_capacity) {
      if (this->m_sorted_luma[0].m_capacity < min_new_capacity) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)this->m_sorted_luma,min_new_capacity,
                   uVar1 + 1 == min_new_capacity,4,(object_mover)0x0,false);
      }
      uVar1 = this->m_sorted_luma[0].m_size;
      memset(this->m_sorted_luma[0].m_p + uVar1,0,(ulong)(min_new_capacity - uVar1) << 2);
    }
    this->m_sorted_luma[0].m_size = min_new_capacity;
  }
  uVar1 = this->m_sorted_luma[1].m_size;
  if (uVar1 != min_new_capacity) {
    if (uVar1 <= min_new_capacity) {
      if (this->m_sorted_luma[1].m_capacity < min_new_capacity) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)(this->m_sorted_luma + 1),min_new_capacity,
                   uVar1 + 1 == min_new_capacity,4,(object_mover)0x0,false);
      }
      uVar1 = this->m_sorted_luma[1].m_size;
      memset(this->m_sorted_luma[1].m_p + uVar1,0,(ulong)(min_new_capacity - uVar1) << 2);
    }
    this->m_sorted_luma[1].m_size = min_new_capacity;
  }
  if (min_new_capacity != 0) {
    puVar2 = (this->m_luma).m_p;
    pcVar3 = this->m_pParams->m_pSrc_pixels;
    puVar4 = this->m_sorted_luma[0].m_p;
    uVar10 = 0;
    do {
      local_1c[0] = (float)pcVar3[uVar10].field_0.field_0.r;
      local_1c[1] = (float)pcVar3[uVar10].field_0.field_0.g;
      local_1c[2] = (float)pcVar3[uVar10].field_0.field_0.b;
      lVar11 = 0;
      do {
        *(float *)((long)&local_28 + lVar11 * 4) =
             local_1c[lVar11] + *(float *)((long)&local_28 + lVar11 * 4);
        lVar11 = lVar11 + 1;
      } while (lVar11 != 3);
      puVar2[uVar10] =
           (ushort)pcVar3[uVar10].field_0.field_0.b +
           (ushort)pcVar3[uVar10].field_0.field_0.g + (ushort)pcVar3[uVar10].field_0.field_0.r;
      puVar4[uVar10] = (uint)uVar10;
      uVar10 = uVar10 + 1;
    } while (uVar10 != min_new_capacity);
  }
  lVar11 = 0;
  do {
    *(float *)((long)&local_28 + lVar11 * 4) =
         *(float *)((long)&local_28 + lVar11 * 4) / (float)min_new_capacity;
    lVar11 = lVar11 + 1;
  } while (lVar11 != 3);
  *(undefined8 *)(this->m_avg_color).m_s = local_28;
  (this->m_avg_color).m_s[2] = local_20;
  iVar6 = this->m_limit;
  fVar12 = (float)iVar6;
  iVar8 = (int)(long)(((this->m_avg_color).m_s[0] * fVar12) / 255.0 + 0.5);
  iVar9 = iVar6;
  if (iVar8 < iVar6) {
    iVar9 = iVar8;
  }
  if (iVar8 < 0) {
    iVar9 = 0;
  }
  this->m_br = iVar9;
  iVar8 = (int)(long)(((this->m_avg_color).m_s[1] * fVar12) / 255.0 + 0.5);
  iVar9 = iVar6;
  if (iVar8 < iVar6) {
    iVar9 = iVar8;
  }
  if (iVar8 < 0) {
    iVar9 = 0;
  }
  this->m_bg = iVar9;
  iVar9 = (int)(long)((fVar12 * (this->m_avg_color).m_s[2]) / 255.0 + 0.5);
  if (iVar9 < iVar6) {
    iVar6 = iVar9;
  }
  if (iVar9 < 0) {
    iVar6 = 0;
  }
  this->m_bb = iVar6;
  if ((this->m_pParams->super_crn_etc1_pack_params).m_quality < cCRNETCQualitySlow) {
    puVar7 = indirect_radix_sort<unsigned_int,unsigned_short>
                       (min_new_capacity,this->m_sorted_luma[0].m_p,this->m_sorted_luma[1].m_p,
                        (this->m_luma).m_p,0,2,false);
    this->m_pSorted_luma_indices = puVar7;
    puVar4 = this->m_sorted_luma[0].m_p;
    this->m_pSorted_luma = puVar4;
    if (puVar7 == puVar4) {
      this->m_pSorted_luma = this->m_sorted_luma[1].m_p;
    }
    if (min_new_capacity != 0) {
      puVar2 = (this->m_luma).m_p;
      puVar5 = this->m_pSorted_luma;
      uVar10 = 0;
      do {
        puVar5[uVar10] = (uint)puVar2[puVar7[uVar10]];
        uVar10 = uVar10 + 1;
      } while (min_new_capacity != uVar10);
    }
  }
  (this->m_best_solution).m_coords.m_color4 = false;
  (this->m_best_solution).m_coords.m_unscaled_color =
       (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)0x0;
  (this->m_best_solution).m_coords.m_inten_table = 0;
  (this->m_best_solution).m_valid = false;
  (this->m_best_solution).m_error = 0xffffffffffffffff;
  return 0;
}

Assistant:

void etc1_optimizer::init(const params& params, results& result)
    {
        m_pParams = &params;
        m_pResult = &result;

        const uint n = m_pParams->m_num_src_pixels;

        m_selectors.resize(n);
        m_best_selectors.resize(n);
        m_temp_selectors.resize(n);
        m_trial_solution.m_selectors.resize(n);
        m_best_solution.m_selectors.resize(n);

        m_limit = m_pParams->m_use_color4 ? 15 : 31;

        vec3F avg_color(0.0f);

        m_luma.resize(n);
        m_sorted_luma[0].resize(n);
        m_sorted_luma[1].resize(n);

        for (uint i = 0; i < n; i++)
        {
            const color_quad_u8& c = m_pParams->m_pSrc_pixels[i];
            const vec3F fc(c.r, c.g, c.b);

            avg_color += fc;

            m_luma[i] = static_cast<uint16>(c.r + c.g + c.b);
            m_sorted_luma[0][i] = i;
        }
        avg_color /= static_cast<float>(n);
        m_avg_color = avg_color;

        m_br = math::clamp<int>(static_cast<uint>(m_avg_color[0] * m_limit / 255.0f + .5f), 0, m_limit);
        m_bg = math::clamp<int>(static_cast<uint>(m_avg_color[1] * m_limit / 255.0f + .5f), 0, m_limit);
        m_bb = math::clamp<int>(static_cast<uint>(m_avg_color[2] * m_limit / 255.0f + .5f), 0, m_limit);

        if (m_pParams->m_quality <= cCRNETCQualityMedium)
        {
            m_pSorted_luma_indices = indirect_radix_sort(n, m_sorted_luma[0].get_ptr(), m_sorted_luma[1].get_ptr(), m_luma.get_ptr(), 0, sizeof(m_luma[0]), false);
            m_pSorted_luma = m_sorted_luma[0].get_ptr();
            if (m_pSorted_luma_indices == m_sorted_luma[0].get_ptr())
            {
                m_pSorted_luma = m_sorted_luma[1].get_ptr();
            }

            for (uint i = 0; i < n; i++)
            {
                m_pSorted_luma[i] = m_luma[m_pSorted_luma_indices[i]];
            }
        }

        m_best_solution.m_coords.clear();
        m_best_solution.m_valid = false;
        m_best_solution.m_error = cUINT64_MAX;
    }